

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

int systemTimeYearMatching(int year)

{
  bool bVar1;
  int in_EDI;
  int res;
  int dow;
  int local_34;
  undefined8 in_stack_ffffffffffffffd0;
  int *local_28;
  int *local_20;
  int *local_18;
  
  local_34 = QGregorianCalendar::yearStartWeekDay((int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  bVar1 = QGregorianCalendar::leapTest(in_EDI);
  if (bVar1) {
    if (in_EDI < 0x7b2) {
      local_18 = systemTimeYearMatching::forLeapEarly;
    }
    else {
      local_18 = systemTimeYearMatching::forLeapLate;
    }
    local_20 = local_18;
  }
  else {
    if (in_EDI < 0x7b2) {
      local_28 = systemTimeYearMatching::regularEarly;
    }
    else {
      local_28 = systemTimeYearMatching::regularLate;
    }
    local_20 = local_28;
  }
  if (local_34 == 7) {
    local_34 = 0;
  }
  return local_20[local_34];
}

Assistant:

static int systemTimeYearMatching(int year)
{
#if defined(Q_OS_WIN) || defined(Q_OS_WASM)// They don't support times before the epoch
    static constexpr int forLeapEarly[] = { 1984, 1996, 1980, 1992, 1976, 1988, 1972 };
    static constexpr int regularEarly[] = { 1978, 1973, 1974, 1975, 1970, 1971, 1977 };
#else // First year fully in 32-bit time_t range is 1902
    static constexpr int forLeapEarly[] = { 1928, 1912, 1924, 1908, 1920, 1904, 1916 };
    static constexpr int regularEarly[] = { 1905, 1906, 1907, 1902, 1903, 1909, 1910 };
#endif
    static constexpr int forLeapLate[] = { 2012, 2024, 2036, 2020, 2032, 2016, 2028 };
    static constexpr int regularLate[] = { 2034, 2035, 2030, 2031, 2037, 2027, 2033 };
    const int dow = QGregorianCalendar::yearStartWeekDay(year);
    Q_ASSERT(dow == QDate(year, 1, 1).dayOfWeek());
    const int res = (QGregorianCalendar::leapTest(year)
                     ? (year < 1970 ? forLeapEarly : forLeapLate)
                     : (year < 1970 ? regularEarly : regularLate))[dow == 7 ? 0 : dow];
    Q_ASSERT(QDate(res, 1, 1).dayOfWeek() == dow);
    Q_ASSERT(QDate(res, 12, 31).dayOfWeek() == QDate(year, 12, 31).dayOfWeek());
    return res;
}